

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUITabControl.cpp
# Opt level: O1

void __thiscall irr::gui::CGUITabControl::removeTabButNotChild(CGUITabControl *this,s32 idx)

{
  int *piVar1;
  int iVar2;
  IGUITab *pIVar3;
  long lVar4;
  pointer ppIVar5;
  pointer ppIVar6;
  s32 idx_00;
  pointer __src;
  
  if (-1 < idx) {
    ppIVar6 = (this->Tabs).m_data.
              super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (idx < (int)((ulong)((long)(this->Tabs).m_data.
                                  super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar6) >> 3))
    {
      pIVar3 = ppIVar6[(uint)idx];
      lVar4 = *(long *)(*(long *)&(pIVar3->super_IGUIElement).super_IEventReceiver + -0x18);
      piVar1 = (int *)((long)&(pIVar3->super_IGUIElement).Children + lVar4 + 8U);
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        (**(code **)(*(long *)((long)&(pIVar3->super_IGUIElement).super_IEventReceiver + lVar4) + 8)
        )();
      }
      ppIVar6 = (this->Tabs).m_data.
                super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      ppIVar5 = (this->Tabs).m_data.
                super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      __src = ppIVar6 + (ulong)(uint)idx + 1;
      if (__src != ppIVar5) {
        memmove(ppIVar6 + (uint)idx,__src,(long)ppIVar5 - (long)__src);
      }
      ppIVar6 = (this->Tabs).m_data.
                super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>.
                _M_impl.super__Vector_impl_data._M_finish + -1;
      (this->Tabs).m_data.
      super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppIVar6;
      iVar2 = this->ActiveTabIndex;
      if (idx < iVar2) {
        idx_00 = iVar2 + -1;
        this->ActiveTabIndex = idx_00;
      }
      else {
        if (iVar2 != idx) {
          return;
        }
        if ((int)((ulong)((long)ppIVar6 -
                         (long)(this->Tabs).m_data.
                               super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3) == idx) {
          this->ActiveTabIndex = iVar2 + -1;
        }
        idx_00 = this->ActiveTabIndex;
      }
      setVisibleTab(this,idx_00);
      return;
    }
  }
  return;
}

Assistant:

void CGUITabControl::removeTabButNotChild(s32 idx)
{
	if (idx < 0 || idx >= (s32)Tabs.size())
		return;

	Tabs[(u32)idx]->drop();
	Tabs.erase((u32)idx);

	if (idx < ActiveTabIndex) {
		--ActiveTabIndex;
		setVisibleTab(ActiveTabIndex);
	} else if (idx == ActiveTabIndex) {
		if ((u32)idx == Tabs.size())
			--ActiveTabIndex;
		setVisibleTab(ActiveTabIndex);
	}
}